

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_arithmetic.c
# Opt level: O2

t_int * times_perf8(t_int *w)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  t_int tVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  long lVar22;
  
  lVar4 = w[1];
  lVar5 = w[2];
  lVar6 = w[3];
  tVar7 = w[4];
  for (lVar22 = 0; (int)tVar7 != (int)lVar22; lVar22 = lVar22 + 8) {
    pfVar1 = (float *)(lVar4 + lVar22 * 4);
    fVar8 = pfVar1[1];
    fVar9 = pfVar1[2];
    fVar10 = pfVar1[3];
    pfVar2 = (float *)(lVar4 + 0x10 + lVar22 * 4);
    fVar11 = *pfVar2;
    fVar12 = pfVar2[1];
    fVar13 = pfVar2[2];
    fVar14 = pfVar2[3];
    pfVar2 = (float *)(lVar5 + lVar22 * 4);
    fVar15 = pfVar2[1];
    fVar16 = pfVar2[2];
    fVar17 = pfVar2[3];
    pfVar3 = (float *)(lVar5 + 0x10 + lVar22 * 4);
    fVar18 = *pfVar3;
    fVar19 = pfVar3[1];
    fVar20 = pfVar3[2];
    fVar21 = pfVar3[3];
    pfVar3 = (float *)(lVar6 + lVar22 * 4);
    *pfVar3 = *pfVar2 * *pfVar1;
    pfVar3[1] = fVar15 * fVar8;
    pfVar3[2] = fVar16 * fVar9;
    pfVar3[3] = fVar17 * fVar10;
    pfVar1 = (float *)(lVar6 + 0x10 + lVar22 * 4);
    *pfVar1 = fVar18 * fVar11;
    pfVar1[1] = fVar19 * fVar12;
    pfVar1[2] = fVar20 * fVar13;
    pfVar1[3] = fVar21 * fVar14;
  }
  return w + 5;
}

Assistant:

t_int *times_perf8(t_int *w)
{
    t_sample *in1 = (t_sample *)(w[1]);
    t_sample *in2 = (t_sample *)(w[2]);
    t_sample *out = (t_sample *)(w[3]);
    int n = (int)(w[4]);
    for (; n; n -= 8, in1 += 8, in2 += 8, out += 8)
    {
        t_sample f0 = in1[0], f1 = in1[1], f2 = in1[2], f3 = in1[3];
        t_sample f4 = in1[4], f5 = in1[5], f6 = in1[6], f7 = in1[7];

        t_sample g0 = in2[0], g1 = in2[1], g2 = in2[2], g3 = in2[3];
        t_sample g4 = in2[4], g5 = in2[5], g6 = in2[6], g7 = in2[7];

        out[0] = f0 * g0; out[1] = f1 * g1; out[2] = f2 * g2; out[3] = f3 * g3;
        out[4] = f4 * g4; out[5] = f5 * g5; out[6] = f6 * g6; out[7] = f7 * g7;
    }
    return (w+5);
}